

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ReduceMeanLayerParams::SerializeWithCachedSizes
          (ReduceMeanLayerParams *this,CodedOutputStream *output)

{
  byte *pbVar1;
  bool bVar2;
  ulong *puVar3;
  int iVar4;
  int iVar5;
  byte *pbVar6;
  uint uVar7;
  ulong value;
  ulong uVar8;
  int index;
  uint value_00;
  
  if (0 < (this->axes_).current_size_) {
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,10);
    }
    else {
      *output->buffer_ = '\n';
      output->buffer_ = output->buffer_ + 1;
      output->buffer_size_ = output->buffer_size_ + -1;
    }
    value_00 = this->_axes_cached_byte_size_;
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,value_00);
    }
    else {
      pbVar1 = output->buffer_;
      pbVar6 = pbVar1;
      uVar7 = value_00;
      if (0x7f < value_00) {
        do {
          *pbVar6 = (byte)value_00 | 0x80;
          uVar7 = value_00 >> 7;
          pbVar6 = pbVar6 + 1;
          bVar2 = 0x3fff < value_00;
          value_00 = uVar7;
        } while (bVar2);
      }
      *pbVar6 = (byte)uVar7;
      iVar4 = ((int)pbVar6 - (int)pbVar1) + 1;
      output->buffer_ = output->buffer_ + iVar4;
      output->buffer_size_ = output->buffer_size_ - iVar4;
    }
  }
  iVar4 = (this->axes_).current_size_;
  if (0 < iVar4) {
    index = 0;
    do {
      puVar3 = (ulong *)google::protobuf::RepeatedField<long>::Get(&this->axes_,index);
      value = *puVar3;
      if (output->buffer_size_ < 10) {
        google::protobuf::io::CodedOutputStream::WriteVarint64SlowPath(output,value);
      }
      else {
        pbVar1 = output->buffer_;
        pbVar6 = pbVar1;
        uVar8 = value;
        if (0x7f < value) {
          do {
            *pbVar6 = (byte)value | 0x80;
            uVar8 = value >> 7;
            pbVar6 = pbVar6 + 1;
            bVar2 = 0x3fff < value;
            value = uVar8;
          } while (bVar2);
        }
        *pbVar6 = (byte)uVar8;
        iVar5 = ((int)pbVar6 - (int)pbVar1) + 1;
        output->buffer_ = output->buffer_ + iVar5;
        output->buffer_size_ = output->buffer_size_ - iVar5;
      }
      index = index + 1;
    } while (index != iVar4);
  }
  if (this->keepdims_ != false) {
    google::protobuf::internal::WireFormatLite::WriteBool(2,true,output);
  }
  if (this->reduceall_ != true) {
    return;
  }
  google::protobuf::internal::WireFormatLite::WriteBool(3,true,output);
  return;
}

Assistant:

void ReduceMeanLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ReduceMeanLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int64 axes = 1;
  if (this->axes_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_axes_cached_byte_size_);
  }
  for (int i = 0, n = this->axes_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64NoTag(
      this->axes(i), output);
  }

  // bool keepDims = 2;
  if (this->keepdims() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(2, this->keepdims(), output);
  }

  // bool reduceAll = 3;
  if (this->reduceall() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(3, this->reduceall(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ReduceMeanLayerParams)
}